

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::ExpressionResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionResultBuilder *this,AssertionInfo *info)

{
  string *__rhs;
  string *__lhs;
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong *puVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __lhs = &(this->m_exprComponents).op;
  iVar4 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar4 == 0) {
    if ((this->m_exprComponents).lhs._M_string_length != 0) {
      std::operator+(__return_storage_ptr__,__lhs,&(this->m_exprComponents).lhs);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (info->capturedExpression)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (info->capturedExpression)._M_string_length);
    return __return_storage_ptr__;
  }
  iVar4 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar4 == 0) {
    pcVar2 = (this->m_exprComponents).lhs._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + (this->m_exprComponents).lhs._M_string_length);
    std::__cxx11::string::append((char *)&local_130);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,
                                (ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_50.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00125895;
  }
  iVar4 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar4 != 0) {
    __rhs = &(this->m_exprComponents).lhs;
    uVar9 = (this->m_exprComponents).lhs._M_string_length;
    uVar1 = (this->m_exprComponents).rhs._M_string_length;
    if (uVar1 + uVar9 < 0x1e) {
      pcVar2 = (__rhs->_M_dataplus)._M_p;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_110,pcVar2,pcVar2 + uVar9);
      std::__cxx11::string::append((char *)&local_110);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_110,
                                  (ulong)(this->m_exprComponents).op._M_dataplus._M_p);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0.field_2._8_8_ = plVar5[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_f0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_130.field_2._M_allocated_capacity = *psVar7;
        local_130.field_2._8_8_ = puVar6[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar7;
        local_130._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_130._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,
                                  (ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      local_50.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) {
        return __return_storage_ptr__;
      }
    }
    else if (uVar1 < 0x46 && uVar9 < 0x46) {
      std::operator+(&local_d0,"\n\t",__rhs);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_110.field_2._M_allocated_capacity = *psVar7;
        local_110.field_2._8_8_ = puVar6[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar7;
        local_110._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_110._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::operator+(&local_f0,&local_110,__lhs);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_130.field_2._M_allocated_capacity = *psVar7;
        local_130.field_2._8_8_ = puVar6[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar7;
        local_130._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_130._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::operator+(__return_storage_ptr__,&local_130,&(this->m_exprComponents).rhs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
        return __return_storage_ptr__;
      }
    }
    else {
      std::operator+(&local_b0,"\n",__rhs);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0.field_2._8_8_ = puVar6[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_d0._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_d0,(ulong)(this->m_exprComponents).op._M_dataplus._M_p);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_110.field_2._M_allocated_capacity = *psVar7;
        local_110.field_2._8_8_ = puVar6[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar7;
        local_110._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_110._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0.field_2._8_8_ = plVar5[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_f0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_f0,(ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_130.field_2._M_allocated_capacity = *psVar7;
        local_130.field_2._8_8_ = puVar6[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar7;
        local_130._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_130._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_50.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        return __return_storage_ptr__;
      }
    }
    goto LAB_00125895;
  }
  std::operator+(&local_50,"{can\'t expand - use ",&info->macroName);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_80 = *puVar8;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar8;
    local_90 = (ulong *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&info->capturedExpression);
  uVar9 = 0xf;
  if (local_90 != &local_80) {
    uVar9 = local_80;
  }
  if (uVar9 < (ulong)(local_68 + local_88)) {
    uVar9 = 0xf;
    if (local_70 != local_60) {
      uVar9 = local_60[0];
    }
    if (uVar9 < (ulong)(local_68 + local_88)) goto LAB_00125180;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_00125180:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_b0._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)psVar7 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_d0.field_2._M_allocated_capacity = *psVar7;
    local_d0.field_2._8_8_ = puVar6[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar7;
    local_d0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_d0._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_d0,(ulong)(info->macroName)._M_dataplus._M_p);
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_110.field_2._M_allocated_capacity = *psVar7;
    local_110.field_2._8_8_ = puVar6[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar7;
    local_110._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_110._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0.field_2._8_8_ = plVar5[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_f0,(ulong)(info->capturedExpression)._M_dataplus._M_p);
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_130.field_2._M_allocated_capacity = *psVar7;
    local_130.field_2._8_8_ = puVar6[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar7;
    local_130._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_130._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return __return_storage_ptr__;
  }
LAB_00125895:
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionResultBuilder::reconstructExpression( const AssertionInfo& info ) const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? info.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 30 )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else if( m_exprComponents.lhs.size() < 70 && m_exprComponents.rhs.size() < 70 )
                return "\n\t" + m_exprComponents.lhs + "\n\t" + m_exprComponents.op + "\n\t" + m_exprComponents.rhs;
            else
                return "\n" + m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs + "\n\n";
        }
        else
            return "{can't expand - use " + info.macroName + "_FALSE( " + info.capturedExpression.substr(1) + " ) instead of " + info.macroName + "( " + info.capturedExpression + " ) for better diagnostics}";
    }